

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O1

void __thiscall Imf_3_4::TimeCode::setFrame(TimeCode *this,int value)

{
  ArgExc *this_00;
  
  if ((uint)value < 0x1e) {
    this->_time = this->_time & 0xffffffc0 | value + ((uint)value / 10) * 6;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Cannot set frame field in time code. New value is out of range.")
  ;
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setFrame (int value)
{
    if (value < 0 || value > 29)
        throw IEX_NAMESPACE::ArgExc ("Cannot set frame field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 0, 5, binaryToBcd (value));
}